

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall QToolBarAreaLayout::apply(QToolBarAreaLayout *this,bool animate)

{
  long lVar1;
  byte animate_00;
  bool bVar2;
  int iVar3;
  QList<QToolBarAreaLayoutLine> *this_00;
  QRect *boundingRect;
  qsizetype qVar4;
  const_reference pQVar5;
  QRect *this_01;
  const_reference pQVar6;
  QToolBar *pQVar7;
  QToolBarLayout *pQVar8;
  QPoint size_00;
  byte in_SIL;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QToolBarLayout *tbl;
  QToolBar *toolBar;
  QWidget *widget;
  QToolBarAreaLayoutItem *item;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  LayoutDirection dir;
  QMainWindowLayout *layout;
  undefined7 in_stack_00000088;
  QSize size;
  QPoint tr;
  QRect geo;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QToolBarLayout *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_7c;
  int local_6c;
  int local_60;
  QRect *_final_geometry;
  QRect in_stack_ffffffffffffffc0;
  QToolBarLayout *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  animate_00 = in_SIL & 1;
  _final_geometry = in_RDI;
  qt_mainwindow_layout((QMainWindow *)0x6f3b06);
  QWidget::layoutDirection((QWidget *)0x6f3b1f);
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    this_00 = (QList<QToolBarAreaLayoutLine> *)((long)in_RDI + (long)local_60 * 0x38 + 0x18);
    local_6c = 0;
    while( true ) {
      boundingRect = (QRect *)(long)local_6c;
      qVar4 = QList<QToolBarAreaLayoutLine>::size(this_00);
      if (qVar4 <= (long)boundingRect) break;
      pQVar5 = QList<QToolBarAreaLayoutLine>::at
                         ((QList<QToolBarAreaLayoutLine> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      bVar2 = QToolBarAreaLayoutLine::skip((QToolBarAreaLayoutLine *)in_stack_ffffffffffffff38);
      if (!bVar2) {
        local_7c = 0;
        while( true ) {
          this_01 = (QRect *)(long)local_7c;
          qVar4 = QList<QToolBarAreaLayoutItem>::size(&pQVar5->toolBarItems);
          if (qVar4 <= (long)this_01) break;
          pQVar6 = QList<QToolBarAreaLayoutItem>::at
                             ((QList<QToolBarAreaLayoutItem> *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          bVar2 = QToolBarAreaLayoutItem::skip((QToolBarAreaLayoutItem *)in_stack_ffffffffffffff38);
          if ((!bVar2) && ((pQVar6->gap & 1U) == 0)) {
            this_02 = (QToolBarLayout *)&DAT_aaaaaaaaaaaaaaaa;
            QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
            if ((in_RDI[0xf].x2.m_i & 1) != 0) {
              if (pQVar5->o == Horizontal) {
                QRect::top((QRect *)0x6f3c90);
                QRect::setTop((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                              ,in_stack_ffffffffffffff2c);
                QRect::bottom((QRect *)0x6f3ca9);
                QRect::setBottom((QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30),
                                 in_stack_ffffffffffffff2c);
                QRect::left((QRect *)0x6f3cc2);
                QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
                QRect::left((QRect *)0x6f3ce3);
                QRect::setRight((QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),
                                in_stack_ffffffffffffff2c);
              }
              else {
                QRect::left((QRect *)0x6f3d11);
                QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
                QRect::right((QRect *)0x6f3d2a);
                QRect::setRight((QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),
                                in_stack_ffffffffffffff2c);
                QRect::top((QRect *)0x6f3d43);
                QRect::setTop((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                              ,in_stack_ffffffffffffff2c);
                QRect::top((QRect *)0x6f3d64);
                QRect::setBottom((QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30),
                                 in_stack_ffffffffffffff2c);
              }
            }
            (*pQVar6->widgetItem->_vptr_QLayoutItem[0xd])();
            pQVar7 = qobject_cast<QToolBar*>((QObject *)0x6f3da5);
            if (pQVar7 != (QToolBar *)0x0) {
              QWidget::layout((QWidget *)0x6f3dc0);
              pQVar8 = qobject_cast<QToolBarLayout*>((QObject *)0x6f3dc8);
              if (((pQVar8->super_QLayout).super_QLayoutItem.field_0xc & 1) != 0) {
                size_00 = QRect::topRight((QRect *)CONCAT44(in_stack_ffffffffffffff2c,
                                                            in_stack_ffffffffffffff28));
                QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
                QToolBarLayout::expandedSize(this_02,(QSize *)size_00);
                QRect::setSize(this_01,(QSize *)CONCAT44(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40));
                QRect::moveTopRight((QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30),
                                    (QPoint *)
                                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
                in_stack_ffffffffffffff44 = QRect::bottom((QRect *)0x6f3e7f);
                iVar3 = QRect::bottom((QRect *)0x6f3e8d);
                if (iVar3 < in_stack_ffffffffffffff44) {
                  QRect::bottom((QRect *)0x6f3ea1);
                  QRect::moveBottom((QRect *)CONCAT44(in_stack_ffffffffffffff44,
                                                      in_stack_ffffffffffffff40),
                                    (int)((ulong)pQVar8 >> 0x20));
                }
                in_stack_ffffffffffffff34 = QRect::right((QRect *)0x6f3ebd);
                iVar3 = QRect::right((QRect *)0x6f3ecb);
                if (iVar3 < in_stack_ffffffffffffff34) {
                  QRect::right((QRect *)0x6f3edf);
                  QRect::moveRight((QRect *)CONCAT44(in_stack_ffffffffffffff44,
                                                     in_stack_ffffffffffffff40),
                                   (int)((ulong)pQVar8 >> 0x20));
                }
                iVar3 = QRect::left((QRect *)0x6f3efb);
                if (iVar3 < 0) {
                  QRect::moveLeft((QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                  in_stack_ffffffffffffff2c);
                }
                iVar3 = QRect::top((QRect *)0x6f3f1c);
                in_stack_ffffffffffffff38 = pQVar8;
                if (iVar3 < 0) {
                  QRect::moveTop((QRect *)CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                 (int)((ulong)pQVar8 >> 0x20));
                  in_stack_ffffffffffffff38 = pQVar8;
                }
              }
            }
            if (((in_RDI[0xf].x2.m_i & 1) != 0) && ((int)this_00[1].d.size == 1)) {
              in_stack_ffffffffffffffc0 =
                   QStyle::visualRect((LayoutDirection)((ulong)in_RDI >> 0x20),boundingRect,this_01)
              ;
            }
            QWidgetAnimator::animate
                      (in_stack_ffffffffffffffc0._0_8_,
                       (QWidget *)CONCAT17(animate,in_stack_00000088),_final_geometry,
                       (bool)animate_00);
          }
          local_7c = local_7c + 1;
        }
      }
      local_6c = local_6c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayout::apply(bool animate)
{
    QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
    Q_ASSERT(layout != nullptr);

    Qt::LayoutDirection dir = mainWindow->layoutDirection();

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);
            if (line.skip())
                continue;

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip() || item.gap)
                    continue;

                QRect geo;
                if (visible) {
                    if (line.o == Qt::Horizontal) {
                        geo.setTop(line.rect.top());
                        geo.setBottom(line.rect.bottom());
                        geo.setLeft(line.rect.left() + item.pos);
                        geo.setRight(line.rect.left() + item.pos + item.size - 1);
                    } else {
                        geo.setLeft(line.rect.left());
                        geo.setRight(line.rect.right());
                        geo.setTop(line.rect.top() + item.pos);
                        geo.setBottom(line.rect.top() + item.pos + item.size - 1);
                    }
                }

                QWidget *widget = item.widgetItem->widget();
                if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
                    QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(toolBar->layout());
                    if (tbl->expanded) {
                        QPoint tr = geo.topRight();
                        QSize size = tbl->expandedSize(geo.size());
                        geo.setSize(size);
                        geo.moveTopRight(tr);
                        if (geo.bottom() > rect.bottom())
                            geo.moveBottom(rect.bottom());
                        if (geo.right() > rect.right())
                            geo.moveRight(rect.right());
                        if (geo.left() < 0)
                            geo.moveLeft(0);
                        if (geo.top() < 0)
                            geo.moveTop(0);
                    }
                }

                if (visible && dock.o == Qt::Horizontal)
                    geo = QStyle::visualRect(dir, line.rect, geo);

                layout->widgetAnimator.animate(widget, geo, animate);
            }
        }
    }
}